

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::CustomLayerParams::MergePartialFromCodedStream
          (CustomLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  string *psVar7;
  WeightParams *value;
  char *field_name;
  char cVar8;
  int iVar9;
  ulong uVar10;
  pointer data;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  parser;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar10 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_001d561c;
        uVar10 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = uVar10 | 0x100000000;
    }
    else {
LAB_001d561c:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    uVar6 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto LAB_001d548e;
    uVar5 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar8 = (char)uVar10;
    if (uVar5 == 0x28) {
      if (cVar8 != 'B') goto LAB_001d548e;
      psVar7 = mutable_description_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar7);
      if (!bVar4) goto LAB_001d5653;
      psVar7 = (this->description_).ptr_;
      data = (psVar7->_M_dataplus)._M_p;
      iVar9 = (int)psVar7->_M_string_length;
      field_name = "CoreML.Specification.CustomLayerParams.description";
LAB_001d5612:
      bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        (data,iVar9,PARSE,field_name);
LAB_001d54ae:
      if (bVar4 == false) goto LAB_001d5653;
LAB_001d54b6:
      iVar9 = 0;
    }
    else {
      if (uVar5 == 0x14) {
        if (cVar8 == -0x5e) {
          value = google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::Add
                            (&this->weights_);
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::WeightParams>(input,value);
          goto LAB_001d54ae;
        }
LAB_001d548e:
        if (uVar6 == 0) {
          return true;
        }
        if ((uVar6 & 7) == 4) {
          return true;
        }
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
        goto LAB_001d54ae;
      }
      if (uVar5 != 0x1e) {
        if ((uVar5 != 10) || (cVar8 != 'R')) goto LAB_001d548e;
        psVar7 = mutable_classname_abi_cxx11_(this);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar7);
        if (bVar4) {
          psVar7 = (this->classname_).ptr_;
          data = (psVar7->_M_dataplus)._M_p;
          iVar9 = (int)psVar7->_M_string_length;
          field_name = "CoreML.Specification.CustomLayerParams.className";
          goto LAB_001d5612;
        }
        goto LAB_001d5653;
      }
      if (cVar8 != -0xe) goto LAB_001d548e;
      parser.key_._M_dataplus._M_p = (pointer)&parser.key_.field_2;
      parser.key_._M_string_length = 0;
      parser.key_.field_2._M_local_buf[0] = '\0';
      parser.entry_.ptr_ =
           (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
            *)0x0;
      parser.mf_ = &this->parameters_;
      parser.map_ = &(this->parameters_).map_;
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<google::protobuf::internal::MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>,google::protobuf::MessageLite,std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>::Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>,std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>,google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>>>
                        (input,&parser);
      if (bVar4) {
        bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (parser.key_._M_dataplus._M_p,(int)parser.key_._M_string_length,PARSE,
                           "CoreML.Specification.CustomLayerParams.ParametersEntry.key");
        iVar9 = 6;
        if (bVar4) {
          iVar9 = 0;
        }
      }
      else {
        bVar4 = false;
        iVar9 = 6;
      }
      google::protobuf::internal::
      MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
      ::
      Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
      ::~Parser(&parser);
      if (bVar4 != false) goto LAB_001d54b6;
    }
  } while (iVar9 == 0);
  bVar4 = true;
  if (iVar9 == 6) {
LAB_001d5653:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CustomLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CustomLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string className = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_classname()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->classname().data(), this->classname().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomLayerParams.className"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.WeightParams weights = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // map<string, .CoreML.Specification.CustomLayerParams.CustomLayerParamValue> parameters = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          CustomLayerParams_ParametersEntry::Parser< ::google::protobuf::internal::MapFieldLite<
              CustomLayerParams_ParametersEntry,
              ::std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue,
              ::google::protobuf::internal::WireFormatLite::TYPE_STRING,
              ::google::protobuf::internal::WireFormatLite::TYPE_MESSAGE,
              0 >,
            ::google::protobuf::Map< ::std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue > > parser(&parameters_);
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
              input, &parser));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            parser.key().data(), parser.key().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomLayerParams.ParametersEntry.key"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string description = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_description()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->description().data(), this->description().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomLayerParams.description"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CustomLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CustomLayerParams)
  return false;
#undef DO_
}